

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O2

void ncnn::get_optimal_tile_mnk_int8(int M,int N,int K,int *TILE_M,int *TILE_N,int *TILE_K,int nT)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM1 [64];
  
  auVar8 = in_ZMM1._0_16_;
  iVar2 = get_cpu_level2_cache_size();
  uVar5 = iVar2 >> 1;
  uVar6 = (ulong)(int)uVar5;
  if (nT == 0) {
    nT = get_physical_big_cpu_count();
  }
  if ((long)uVar6 < 0) {
    fVar7 = (float)((ulong)(uVar5 & 1) | uVar6 >> 1);
    fVar7 = fVar7 + fVar7;
  }
  else {
    fVar7 = (float)(int)uVar5;
  }
  auVar1 = vsqrtss_avx(ZEXT416((uint)(fVar7 * 0.33333334)),ZEXT416((uint)(fVar7 * 0.33333334)));
  iVar2 = ((int)auVar1._0_4_ / 4) * 4;
  if (iVar2 < 5) {
    iVar2 = 4;
  }
  *TILE_M = iVar2;
  iVar2 = get_physical_cpu_count();
  if (nT <= iVar2) {
    iVar2 = nT;
  }
  uVar4 = iVar2 * *TILE_M;
  iVar2 = (int)(uVar4 + M + -1) / (int)uVar4;
  uVar5 = (((iVar2 + M + -1) / iVar2 + 3) / 4) * 4;
  if ((int)uVar4 <= (int)uVar5) {
    uVar5 = uVar4;
  }
  if (1 < nT) {
    iVar2 = 1;
    if (1 < (int)uVar5 / nT) {
      iVar2 = (int)uVar5 / nT;
    }
    uVar4 = iVar2 + 3U & 0x7ffffffc;
    if ((int)uVar4 < (int)uVar5) {
      uVar5 = uVar4;
    }
  }
  *TILE_M = uVar5;
  auVar8 = vsqrtss_avx(auVar8,ZEXT416((uint)fVar7));
  iVar2 = ((int)(auVar8._0_4_ - (float)(int)uVar5) / 4) * 4;
  if (iVar2 < 5) {
    iVar2 = 4;
  }
  iVar3 = (iVar2 + K + -1) / iVar2;
  iVar3 = (((iVar3 + K + -1) / iVar3 + 3) / 4) * 4;
  if (iVar2 <= iVar3) {
    iVar3 = iVar2;
  }
  *TILE_K = iVar3;
  if (0 < N) {
    uVar5 = ((int)((uVar6 - (long)(*TILE_M * iVar3)) / (ulong)(long)(iVar3 + *TILE_M * 2)) / 4) * 4;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 5) {
      uVar6 = 4;
    }
    uVar5 = (uint)uVar6;
    uVar6 = ((N + uVar5) - 1) / uVar6;
    uVar4 = (int)(((N + (int)uVar6) - 1) / uVar6) + 3U & 0xfffffffc;
    if (uVar5 <= uVar4) {
      uVar4 = uVar5;
    }
    *TILE_N = uVar4;
  }
  return;
}

Assistant:

static void get_optimal_tile_mnk_int8(int M, int N, int K, int& TILE_M, int& TILE_N, int& TILE_K, int nT)
{
    // resolve optimal tile size from cache size
    const size_t l2_cache_size_int8 = (int)(get_cpu_level2_cache_size() / sizeof(short));

    if (nT == 0)
        nT = get_physical_big_cpu_count();

    // solve M
    {
        int tile_size = (int)sqrt((float)l2_cache_size_int8 / 3);

#if __AVX512F__
        TILE_M = std::max(16, tile_size / 16 * 16);
#elif __AVX2__
        TILE_M = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_M = std::max(4, tile_size / 4 * 4);
#else
        TILE_M = std::max(2, tile_size / 2 * 2);
#endif

        TILE_M *= std::min(nT, get_physical_cpu_count());

        int nn_M = (M + TILE_M - 1) / TILE_M;
#if __AVX512F__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif

        if (nT > 1)
        {
#if __AVX512F__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 15) / 16 * 16);
#elif __AVX2__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 7) / 8 * 8);
#elif __SSE2__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 3) / 4 * 4);
#else
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 1) / 2 * 2);
#endif
        }
    }

    // solve K
    {
        int tile_size = (int)(sqrt((float)l2_cache_size_int8) - TILE_M);

#if __AVX512F__
        TILE_K = std::max(16, tile_size / 16 * 16);
#elif __AVX2__
        TILE_K = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_K = std::max(4, tile_size / 4 * 4);
#else
        TILE_K = std::max(2, tile_size / 2 * 2);
#endif

        int nn_K = (K + TILE_K - 1) / TILE_K;
#if __AVX512F__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 15) / 16 * 16);
#elif __AVX2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#elif __SSE2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 3) / 4 * 4);
#else
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 1) / 2 * 2);
#endif
    }

    if (N > 0)
    {
        int tile_size = (int)((l2_cache_size_int8 - TILE_M * TILE_K) / (TILE_M * 2 + TILE_K));

#if __SSE2__
        TILE_N = std::max(4, tile_size / 4 * 4);
#else
        TILE_N = std::max(1, tile_size);
#endif

        int nn_N = (N + TILE_N - 1) / TILE_N;
#if __SSE2__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#else
        TILE_N = std::min(TILE_N, (N + nn_N - 1) / nn_N);
#endif
    }
}